

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_replace(anm_archive_t *anm,FILE *anmfp,anm_entry_t *entry_first,char *filename,int version)

{
  ushort uVar1;
  ushort uVar2;
  anm_entry_t *paVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uchar *puVar12;
  thtx_header_t *ptVar13;
  anm_entry_t *paVar14;
  image_t *image;
  uint uVar15;
  list_node_t *plVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  format_t format;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long *data;
  int iVar23;
  uint uVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  uint32_t local_c0;
  size_t size;
  uint height;
  uint width;
  image_t local_48;
  undefined1 auVar27 [16];
  
  width = 0;
  height = 0;
  util_total_entry_size(entry_first,&width,&height);
  uVar5 = width;
  uVar20 = height;
  uVar11 = (ulong)width;
  uVar21 = (ulong)height;
  if (height != 0 && width != 0) {
    if (version == 0x13) {
      if (option_dont_add_offset_border == 0) {
        bVar25 = entry_first->header->y != 0 || entry_first->header->x != 0;
      }
      else {
        bVar25 = false;
      }
      uVar24 = entry_first->thtx->size;
      if ((((uVar24 < 0x1c) || (data = (long *)entry_first->data, *data != 0xa1a0a0d474e5089)) ||
          (*(int *)((long)data + 0xc) != 0x52444849)) ||
         ((!bVar25 && (entry_first->next_by_name == (anm_entry_t *)0x0)))) {
        if (1 < option_verbose) {
          anm_replace_cold_1();
        }
        if (!bVar25) {
          paVar14 = entry_first->next_by_name;
          if (paVar14 == (anm_entry_t *)0x0) {
            return;
          }
          if (((paVar14->next_by_name == (anm_entry_t *)0x0) &&
              (uVar20 = entry_first->thtx->size, uVar20 == paVar14->thtx->size)) &&
             (iVar10 = bcmp(entry_first->data,paVar14->data,(ulong)uVar20), iVar10 == 0)) {
            return;
          }
        }
        anm_replace_cold_2();
        return;
      }
      if (1 < option_verbose) {
        fprintf(_stderr,"%s: composing %s\n",argv0,filename);
        data = (long *)entry_first->data;
        uVar24 = entry_first->thtx->size;
      }
      image = (image_t *)malloc(0x18);
      png_read_mem(image,data,(ulong)uVar24);
    }
    else {
      image = png_read(filename);
    }
    uVar18 = (ulong)image->width;
    uVar19 = (ulong)image->height;
    if ((image->width < uVar5) || (image->height < uVar20)) {
LAB_0010f0d2:
      fprintf(_stderr,"%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",argv0,
              current_input,entry_first->name,filename,uVar18,uVar19,uVar11,uVar21);
LAB_0010f117:
      exit(1);
    }
    uVar20 = uVar20 * uVar5;
    uVar21 = (ulong)uVar20;
    lVar22 = 0;
    do {
      plVar16 = (anm->entries).head;
      if (plVar16 != (list_node_t *)0x0) {
        lVar17 = 0;
        paVar14 = entry_first;
        do {
          paVar3 = (anm_entry_t *)plVar16->data;
          if (paVar3 == paVar14) {
            ptVar13 = paVar3->thtx;
            format = (format_t)ptVar13->format;
            if (((&DAT_00139420)[lVar22] == (uint)ptVar13->format) && (paVar3->header->hasdata != 0)
               ) {
              if (version == 0x13) {
                if (lVar22 != 1) {
                  anm_replace_cold_3();
                  filename = (char *)anmfp;
                  goto LAB_0010f0d2;
                }
                ptVar13->size = (uint)ptVar13->h * (uint)ptVar13->w * 4;
                free(paVar3->data);
                puVar12 = (uchar *)malloc((ulong)paVar3->thtx->size);
                paVar3->data = puVar12;
                format = 0xffffffff;
              }
              puVar12 = format_from_rgba((uint32_t *)image->data,uVar20,format);
              local_c0 = 0;
              uVar24 = 0;
              if (option_dont_add_offset_border == 0) {
                local_c0 = paVar3->header->x;
                uVar24 = paVar3->header->y;
              }
              ptVar13 = paVar3->thtx;
              uVar15 = ptVar13->h + uVar24;
              if (anmfp == (FILE *)0x0) {
                if (uVar24 < uVar15) {
                  iVar23 = uVar5 * uVar24;
                  iVar10 = 0;
                  do {
                    puVar4 = paVar3->data;
                    uVar1 = ptVar13->w;
                    uVar15 = format_Bpp(format);
                    uVar6 = format_Bpp(format);
                    uVar8 = format_Bpp(format);
                    uVar2 = paVar3->thtx->w;
                    uVar9 = format_Bpp(format);
                    memcpy(puVar4 + (uint)uVar1 * uVar15 * iVar10,
                           puVar12 + (ulong)(uVar8 * local_c0) + (ulong)(uVar6 * iVar23),
                           (ulong)(uVar2 * uVar9));
                    ptVar13 = paVar3->thtx;
                    iVar7 = iVar10 + uVar24;
                    iVar10 = iVar10 + 1;
                    iVar23 = iVar23 + uVar5;
                  } while (iVar7 + 1U < ptVar13->h + uVar24);
                }
              }
              else if (uVar24 < uVar15) {
                iVar23 = uVar5 * uVar24;
                iVar10 = 0;
                do {
                  uVar15 = paVar3->header->thtxoffset;
                  uVar1 = ptVar13->w;
                  uVar6 = format_Bpp(format);
                  iVar7 = file_seek(anmfp,(ulong)((uint)uVar1 * uVar6 * iVar10) + lVar17 + 0x10 +
                                          (ulong)uVar15);
                  if (iVar7 == 0) goto LAB_0010f117;
                  uVar15 = format_Bpp(format);
                  uVar6 = format_Bpp(format);
                  uVar1 = paVar3->thtx->w;
                  uVar8 = format_Bpp(format);
                  iVar7 = file_write(anmfp,puVar12 + (ulong)(uVar6 * local_c0) +
                                                     (ulong)(uVar15 * iVar23),(ulong)(uVar1 * uVar8)
                                    );
                  if (iVar7 == 0) goto LAB_0010f117;
                  ptVar13 = paVar3->thtx;
                  iVar7 = uVar24 + iVar10;
                  iVar10 = iVar10 + 1;
                  iVar23 = iVar23 + uVar5;
                } while (iVar7 + 1U < ptVar13->h + uVar24);
              }
              free(puVar12);
              if (version == 0x13) {
                local_48.data = paVar3->data;
                uVar24._0_2_ = paVar3->thtx->w;
                uVar24._2_2_ = paVar3->thtx->h;
                auVar27._6_10_ = SUB1610(ZEXT816(0) << 0x40,6);
                auVar27._4_2_ = uVar24._2_2_;
                auVar27._0_4_ = uVar24;
                auVar26._4_12_ = auVar27._4_12_;
                auVar26._0_4_ = uVar24 & 0xffff;
                local_48._8_8_ = auVar26._0_8_;
                local_48.format = 0xffffffff;
                puVar12 = (uchar *)png_write_mem(&local_48,&size);
                paVar3->data = puVar12;
                paVar3->thtx->size = (uint32_t)size;
                free(local_48.data);
              }
              paVar3->processed = 1;
            }
            paVar14 = paVar3->next_by_name;
          }
          lVar17 = lVar17 + (ulong)paVar3->header->nextoffset;
          plVar16 = plVar16->next;
        } while (plVar16 != (list_node_t *)0x0);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != 5);
    free(image->data);
    free(image);
  }
  return;
}

Assistant:

static void
anm_replace(
    anm_archive_t* anm,
    FILE* anmfp,
    anm_entry_t* entry_first,
    const char* filename,
    int version)
{
    const format_t formats[] = {
        FORMAT_RGBA8888,
        FORMAT_BGRA8888,
        FORMAT_RGB565,
        FORMAT_ARGB4444,
        FORMAT_GRAY8
    };
    unsigned int f;
    unsigned int width = 0;
    unsigned int height = 0;
    image_t* image;

    util_total_entry_size(entry_first, &width, &height);
    if (width == 0 || height == 0) {
        /* There's nothing to do. */
        return;
    }

    int is_png = 0;
    /* NEWHU: 19 */
    if (version == 19) {
        anm_entry_t *entry = entry_first;
        const uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
        const uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;
        if (!(png_identify(entry->data, entry->thtx->size) && (ox || oy || entry->next_by_name))) {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: not composing %s\n", argv0, filename);
            /* TH19's ability/dummy.png is used twice, but it's the same texture.
             * Avoid printing a warning in this particular case. */
            if (ox || oy || entry->next_by_name && (entry->next_by_name->next_by_name ||
                    entry->thtx->size != entry->next_by_name->thtx->size ||
                    memcmp(entry->data, entry->next_by_name->data, entry->thtx->size))) {
                fprintf(stderr, "%s: warning: %s can't be composed because it's a JPEG\n", argv0, filename);
            }
            return;
        }
        if (option_verbose >= 2)
            fprintf(stderr, "%s: composing %s\n", argv0, filename);
        image = malloc(sizeof(image_t));
        png_read_mem(image, entry->data, entry->thtx->size);
        is_png = 1;
    } else {
        image = png_read(filename);
    }

    if (width > image->width || height > image->height) {
        fprintf(stderr,
            "%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",
            argv0, current_input, entry_first->name, filename, image->width, image->height,
            width, height);
        exit(1);
    }

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
        long offset = 0;
        anm_entry_t *entry, *entry_next = entry_first;
        list_for_each(&anm->entries, entry) {
            if (entry == entry_next &&
                entry->thtx->format == formats[f] &&
                entry->header->hasdata) {
                unsigned int y;
                format_t fmt = formats[f];

                if (is_png) {
                    if (fmt != FORMAT_BGRA8888) {
                        fprintf(stderr, "%s: %s is not FORMAT_BGRA8888\n", argv0, entry->name);
                        exit(1);
                    }
                    fmt = FORMAT_RGBA8888;
                    entry->thtx->size = entry->thtx->w*entry->thtx->h*4;
                    free(entry->data);
                    entry->data = malloc(entry->thtx->size);
                }

                unsigned char* converted_data = format_from_rgba((uint32_t*)image->data, width * height, fmt);
                const uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
                const uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;

                if (anmfp) {
                    for (y = oy; y < oy + entry->thtx->h; ++y) {
                        if (!file_seek(anmfp,
                            offset + entry->header->thtxoffset + sizeof(thtx_header_t) + (y - oy) * entry->thtx->w * format_Bpp(fmt)))
                            exit(1);
                        if (!file_write(anmfp, converted_data + y * width * format_Bpp(fmt) + ox * format_Bpp(fmt), entry->thtx->w * format_Bpp(fmt)))
                            exit(1);
                    }
                } else {
                    for (y = oy; y < oy + entry->thtx->h; ++y) {
                        memcpy(entry->data + (y - oy) * entry->thtx->w * format_Bpp(fmt),
                               converted_data + y * width * format_Bpp(fmt) + ox * format_Bpp(fmt),
                               entry->thtx->w * format_Bpp(fmt));
                    }
                }

                free(converted_data);

                if (is_png) {
                    image_t image2 = {
                        .data = entry->data,
                        .width = entry->thtx->w,
                        .height = entry->thtx->h,
                        .format = FORMAT_RGBA8888,
                    };
                    size_t size;
                    entry->data = png_write_mem(&image2, &size);
                    entry->thtx->size = size;
                    free(image2.data);
                }

                entry->processed = 1;
            }
            if (entry == entry_next)
                entry_next = entry->next_by_name;

            offset += entry->header->nextoffset;
        }
    }

    free(image->data);
    free(image);
}